

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TrackDescriptor * __thiscall
perfetto::ProcessTrack::Serialize(TrackDescriptor *__return_storage_ptr__,ProcessTrack *this)

{
  bool bVar1;
  ProcessDescriptor *this_00;
  char *pcVar2;
  size_t sVar3;
  allocator local_131;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  StringSplitter splitter;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string cmdline;
  ProcessDescriptor *pd;
  ProcessTrack *this_local;
  TrackDescriptor *desc;
  
  Track::Serialize(__return_storage_ptr__,&this->super_Track);
  this_00 = protos::gen::TrackDescriptor::mutable_process(__return_storage_ptr__);
  protos::gen::ProcessDescriptor::set_pid(this_00,this->pid);
  ::std::__cxx11::string::string((string *)local_58);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"/proc/self/cmdline",&local_79);
  bVar1 = perfetto::base::ReadFile(&local_78,(string *)local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::allocator<char>::~allocator(&local_79);
  if (bVar1) {
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,pcVar2,(allocator<char> *)&splitter.field_0x47);
    protos::gen::ProcessDescriptor::set_process_name(this_00,&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&splitter.field_0x47);
    ::std::__cxx11::string::string((string *)&local_110,(string *)local_58);
    perfetto::base::StringSplitter::StringSplitter((StringSplitter *)local_f0,&local_110,'\0');
    ::std::__cxx11::string::~string((string *)&local_110);
    while (bVar1 = perfetto::base::StringSplitter::Next((StringSplitter *)local_f0), bVar1) {
      pcVar2 = perfetto::base::StringSplitter::cur_token((StringSplitter *)local_f0);
      sVar3 = perfetto::base::StringSplitter::cur_token_size((StringSplitter *)local_f0);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_130,pcVar2,sVar3,&local_131);
      protos::gen::ProcessDescriptor::add_cmdline(this_00,&local_130);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    }
    perfetto::base::StringSplitter::~StringSplitter((StringSplitter *)local_f0);
  }
  ::std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor ProcessTrack::Serialize() const {
  auto desc = Track::Serialize();
  auto pd = desc.mutable_process();
  pd->set_pid(static_cast<int32_t>(pid));
#if PERFETTO_BUILDFLAG(PERFETTO_OS_LINUX) || \
    PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID)
  std::string cmdline;
  if (base::ReadFile("/proc/self/cmdline", &cmdline)) {
    // Since cmdline is a zero-terminated list of arguments, this ends up
    // writing just the first element, i.e., the process name, into the process
    // name field.
    pd->set_process_name(cmdline.c_str());
    base::StringSplitter splitter(std::move(cmdline), '\0');
    while (splitter.Next()) {
      pd->add_cmdline(
          std::string(splitter.cur_token(), splitter.cur_token_size()));
    }
  }
  // TODO(skyostil): Record command line on Windows and Mac.
#endif
  return desc;
}